

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_do_button_image(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,
                          nk_button_behavior b,nk_style_button *style,nk_input *in)

{
  nk_rect r;
  nk_flags *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  nk_command_buffer *in_R8;
  float state_00;
  float fVar1;
  float fVar2;
  float fVar3;
  nk_rect content;
  int ret;
  nk_image *in_stack_ffffffffffffff98;
  nk_style_button *style_00;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  nk_bool local_4;
  
  style_00 = (nk_style_button *)&stack0x00000008;
  if (((in_RSI == 0) || (in_RCX == (nk_flags *)0x0)) || (in_RDI == 0)) {
    local_4 = 0;
  }
  else {
    r._4_8_ = in_RSI;
    r.x = (float)in_EDX;
    r.h = (float)in_RDI;
    local_4 = nk_do_button(in_RCX,in_R8,r,
                           (nk_style_button *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (nk_input *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                           ,(nk_button_behavior)in_stack_ffffffffffffffac,(nk_rect *)style_00);
    state_00 = (float)in_RCX[0x22] + in_stack_ffffffffffffffac;
    fVar1 = (float)in_RCX[0x23] + in_stack_ffffffffffffffb0;
    fVar2 = in_stack_ffffffffffffffb4 - ((float)in_RCX[0x22] + (float)in_RCX[0x22]);
    fVar3 = in_stack_ffffffffffffffb8 - ((float)in_RCX[0x23] + (float)in_RCX[0x23]);
    if (*(long *)(in_RCX + 0x28) != 0) {
      (**(code **)(in_RCX + 0x28))(in_RSI,*(undefined8 *)(in_RCX + 0x26));
    }
    nk_draw_button_image
              (in_R8,(nk_rect *)CONCAT44(local_4,fVar3),(nk_rect *)CONCAT44(fVar2,fVar1),
               (nk_flags)state_00,style_00,in_stack_ffffffffffffff98);
    if (*(long *)(in_RCX + 0x2a) != 0) {
      (**(code **)(in_RCX + 0x2a))(in_RSI,*(undefined8 *)(in_RCX + 0x26));
    }
  }
  return local_4;
}

Assistant:

NK_LIB nk_bool
nk_do_button_image(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
struct nk_image img, enum nk_button_behavior b,
const struct nk_style_button *style, const struct nk_input *in)
{
int ret;
struct nk_rect content;

NK_ASSERT(state);
NK_ASSERT(style);
NK_ASSERT(out);
if (!out || !style || !state)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, b, &content);
content.x += style->image_padding.x;
content.y += style->image_padding.y;
content.w -= 2 * style->image_padding.x;
content.h -= 2 * style->image_padding.y;

if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_image(out, &bounds, &content, *state, style, &img);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}